

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

void draw_cells(double *draw_points,int num_draw_points,string *str)

{
  int local_50;
  int i;
  float z2;
  float y2;
  float x2;
  float z1;
  float y1;
  float x1;
  CreateDxf local_21;
  string *psStack_20;
  CreateDxf Draw;
  string *str_local;
  int num_draw_points_local;
  double *draw_points_local;
  
  psStack_20 = str;
  CreateDxf::CreateDxf(&local_21);
  CreateDxf::DxfBegin(&local_21,psStack_20);
  for (local_50 = 0; local_50 < num_draw_points; local_50 = local_50 + 1) {
    CreateDxf::line(&local_21,(float)draw_points[local_50 * 6],
                    (float)draw_points[(long)(local_50 * 6) + 1],
                    (float)draw_points[(long)(local_50 * 6) + 2],
                    (float)draw_points[(long)(local_50 * 6) + 3],
                    (float)draw_points[(long)(local_50 * 6) + 4],
                    (float)draw_points[(long)(local_50 * 6) + 5],psStack_20);
  }
  CreateDxf::DxfEnd(&local_21,psStack_20);
  CreateDxf::~CreateDxf(&local_21);
  return;
}

Assistant:

void draw_cells(double *draw_points, int num_draw_points, string &str)
{
	CreateDxf Draw;
	Draw.DxfBegin(str);
	float x1, y1, z1, x2, y2, z2;
	for (int i = 0; i < num_draw_points; i++)
	{
		x1 = draw_points[i * 6];
		y1 = draw_points[i * 6 + 1];
		z1 = draw_points[i * 6 + 2];
		x2 = draw_points[i * 6 + 3];
		y2 = draw_points[i * 6 + 4];
		z2 = draw_points[i * 6 + 5];
		Draw.line(x1, y1, z1, x2, y2, z2, str);
	}
	Draw.DxfEnd(str);
}